

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O2

bool basisu::unpack_etc1(etc_block *block,color_rgba *pDst,bool preserve_alpha)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t packed_delta3;
  uint32_t uVar4;
  uint32_t y;
  uint32_t uVar5;
  uint32_t y_2;
  uint32_t y_1;
  uint table_idx;
  color_rgba subblock_colors1 [4];
  color_rgba subblock_colors0 [4];
  
  bVar1 = (block->field_0).m_bytes[3];
  table_idx = bVar1 >> 2 & 7;
  if ((bVar1 & 2) == 0) {
    uVar3 = etc_block::get_base4_color(block,0);
    etc_block::get_abs_subblock_colors(subblock_colors0,uVar3,(uint)(bVar1 >> 5));
    uVar3 = etc_block::get_base4_color(block,1);
    etc_block::get_abs_subblock_colors(subblock_colors1,uVar3,table_idx);
  }
  else {
    uVar3 = etc_block::get_base5_color(block);
    packed_delta3 = etc_block::get_delta3_color(block);
    etc_block::get_diff_subblock_colors(subblock_colors0,uVar3,(uint)(bVar1 >> 5));
    bVar2 = etc_block::get_diff_subblock_colors(subblock_colors1,uVar3,packed_delta3,table_idx);
    if (!bVar2) {
      return false;
    }
  }
  if (preserve_alpha) {
    if ((bVar1 & 1) == 0) {
      for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
        uVar4 = etc_block::get_selector(block,0,uVar5);
        (pDst->field_0).m_comps[0] = subblock_colors0[uVar4].field_0.m_comps[0];
        (pDst->field_0).m_comps[1] = subblock_colors0[uVar4].field_0.m_comps[1];
        (pDst->field_0).m_comps[2] = subblock_colors0[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,1,uVar5);
        pDst[1].field_0.m_comps[0] = subblock_colors0[uVar4].field_0.m_comps[0];
        pDst[1].field_0.m_comps[1] = subblock_colors0[uVar4].field_0.m_comps[1];
        pDst[1].field_0.m_comps[2] = subblock_colors0[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,2,uVar5);
        pDst[2].field_0.m_comps[0] = subblock_colors1[uVar4].field_0.m_comps[0];
        pDst[2].field_0.m_comps[1] = subblock_colors1[uVar4].field_0.m_comps[1];
        pDst[2].field_0.m_comps[2] = subblock_colors1[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,3,uVar5);
        pDst[3].field_0.m_comps[0] = subblock_colors1[uVar4].field_0.m_comps[0];
        pDst[3].field_0.m_comps[1] = subblock_colors1[uVar4].field_0.m_comps[1];
        pDst[3].field_0.m_comps[2] = subblock_colors1[uVar4].field_0.m_comps[2];
        pDst = pDst + 4;
      }
    }
    else {
      for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
        uVar4 = etc_block::get_selector(block,0,uVar5);
        (pDst->field_0).m_comps[0] = subblock_colors0[uVar4].field_0.m_comps[0];
        (pDst->field_0).m_comps[1] = subblock_colors0[uVar4].field_0.m_comps[1];
        (pDst->field_0).m_comps[2] = subblock_colors0[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,1,uVar5);
        pDst[1].field_0.m_comps[0] = subblock_colors0[uVar4].field_0.m_comps[0];
        pDst[1].field_0.m_comps[1] = subblock_colors0[uVar4].field_0.m_comps[1];
        pDst[1].field_0.m_comps[2] = subblock_colors0[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,2,uVar5);
        pDst[2].field_0.m_comps[0] = subblock_colors0[uVar4].field_0.m_comps[0];
        pDst[2].field_0.m_comps[1] = subblock_colors0[uVar4].field_0.m_comps[1];
        pDst[2].field_0.m_comps[2] = subblock_colors0[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,3,uVar5);
        pDst[3].field_0.m_comps[0] = subblock_colors0[uVar4].field_0.m_comps[0];
        pDst[3].field_0.m_comps[1] = subblock_colors0[uVar4].field_0.m_comps[1];
        pDst[3].field_0.m_comps[2] = subblock_colors0[uVar4].field_0.m_comps[2];
        pDst = pDst + 4;
      }
      for (uVar5 = 2; uVar5 != 4; uVar5 = uVar5 + 1) {
        uVar4 = etc_block::get_selector(block,0,uVar5);
        (pDst->field_0).m_comps[0] = subblock_colors1[uVar4].field_0.m_comps[0];
        (pDst->field_0).m_comps[1] = subblock_colors1[uVar4].field_0.m_comps[1];
        (pDst->field_0).m_comps[2] = subblock_colors1[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,1,uVar5);
        pDst[1].field_0.m_comps[0] = subblock_colors1[uVar4].field_0.m_comps[0];
        pDst[1].field_0.m_comps[1] = subblock_colors1[uVar4].field_0.m_comps[1];
        pDst[1].field_0.m_comps[2] = subblock_colors1[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,2,uVar5);
        pDst[2].field_0.m_comps[0] = subblock_colors1[uVar4].field_0.m_comps[0];
        pDst[2].field_0.m_comps[1] = subblock_colors1[uVar4].field_0.m_comps[1];
        pDst[2].field_0.m_comps[2] = subblock_colors1[uVar4].field_0.m_comps[2];
        uVar4 = etc_block::get_selector(block,3,uVar5);
        pDst[3].field_0.m_comps[0] = subblock_colors1[uVar4].field_0.m_comps[0];
        pDst[3].field_0.m_comps[1] = subblock_colors1[uVar4].field_0.m_comps[1];
        pDst[3].field_0.m_comps[2] = subblock_colors1[uVar4].field_0.m_comps[2];
        pDst = pDst + 4;
      }
    }
  }
  else if ((bVar1 & 1) == 0) {
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      uVar4 = etc_block::get_selector(block,0,uVar5);
      *pDst = (color_rgba)subblock_colors0[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,1,uVar5);
      (&pDst->field_0)[1] = subblock_colors0[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,2,uVar5);
      (&pDst->field_0)[2] = subblock_colors1[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,3,uVar5);
      (&pDst->field_0)[3] = subblock_colors1[uVar4].field_0;
      pDst = (color_rgba *)(&pDst->field_0 + 4);
    }
  }
  else {
    for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
      uVar4 = etc_block::get_selector(block,0,uVar5);
      *pDst = (color_rgba)subblock_colors0[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,1,uVar5);
      (&pDst->field_0)[1] = subblock_colors0[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,2,uVar5);
      (&pDst->field_0)[2] = subblock_colors0[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,3,uVar5);
      (&pDst->field_0)[3] = subblock_colors0[uVar4].field_0;
      pDst = (color_rgba *)(&pDst->field_0 + 4);
    }
    for (uVar5 = 2; uVar5 != 4; uVar5 = uVar5 + 1) {
      uVar4 = etc_block::get_selector(block,0,uVar5);
      *pDst = (color_rgba)subblock_colors1[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,1,uVar5);
      (&pDst->field_0)[1] = subblock_colors1[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,2,uVar5);
      (&pDst->field_0)[2] = subblock_colors1[uVar4].field_0;
      uVar4 = etc_block::get_selector(block,3,uVar5);
      (&pDst->field_0)[3] = subblock_colors1[uVar4].field_0;
      pDst = (color_rgba *)(&pDst->field_0 + 4);
    }
  }
  return true;
}

Assistant:

bool unpack_etc1(const etc_block& block, color_rgba *pDst, bool preserve_alpha)
	{
		const bool diff_flag = block.get_diff_bit();
		const bool flip_flag = block.get_flip_bit();
		const uint32_t table_index0 = block.get_inten_table(0);
		const uint32_t table_index1 = block.get_inten_table(1);

		color_rgba subblock_colors0[4];
		color_rgba subblock_colors1[4];

		if (diff_flag)
		{
			const uint16_t base_color5 = block.get_base5_color();
			const uint16_t delta_color3 = block.get_delta3_color();
			etc_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

			if (!etc_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
				return false;
		}
		else
		{
			const uint16_t base_color4_0 = block.get_base4_color(0);
			etc_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

			const uint16_t base_color4_1 = block.get_base4_color(1);
			etc_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
		}

		if (preserve_alpha)
		{
			if (flip_flag)
			{
				for (uint32_t y = 0; y < 2; y++)
				{
					pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
					pDst += 4;
				}

				for (uint32_t y = 2; y < 4; y++)
				{
					pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
					pDst += 4;
				}
			}
			else
			{
				for (uint32_t y = 0; y < 4; y++)
				{
					pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
					pDst += 4;
				}
			}
		}
		else
		{
			if (flip_flag)
			{
				// 0000
				// 0000
				// 1111
				// 1111
				for (uint32_t y = 0; y < 2; y++)
				{
					pDst[0] = subblock_colors0[block.get_selector(0, y)];
					pDst[1] = subblock_colors0[block.get_selector(1, y)];
					pDst[2] = subblock_colors0[block.get_selector(2, y)];
					pDst[3] = subblock_colors0[block.get_selector(3, y)];
					pDst += 4;
				}

				for (uint32_t y = 2; y < 4; y++)
				{
					pDst[0] = subblock_colors1[block.get_selector(0, y)];
					pDst[1] = subblock_colors1[block.get_selector(1, y)];
					pDst[2] = subblock_colors1[block.get_selector(2, y)];
					pDst[3] = subblock_colors1[block.get_selector(3, y)];
					pDst += 4;
				}
			}
			else
			{
				// 0011
				// 0011
				// 0011
				// 0011
				for (uint32_t y = 0; y < 4; y++)
				{
					pDst[0] = subblock_colors0[block.get_selector(0, y)];
					pDst[1] = subblock_colors0[block.get_selector(1, y)];
					pDst[2] = subblock_colors1[block.get_selector(2, y)];
					pDst[3] = subblock_colors1[block.get_selector(3, y)];
					pDst += 4;
				}
			}
		}

		return true;
	}